

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_interface.c
# Opt level: O2

fe_t * fe_init_auto_r(cmd_ln_t *config)

{
  short sVar1;
  int iVar2;
  fe_t *fe;
  int16 *piVar3;
  window_t *in;
  melfb_t *mel;
  ulong uVar4;
  noise_stats_t *pnVar5;
  frame_t *pfVar6;
  powspec_t *ppVar7;
  short sVar8;
  char *pcVar9;
  long lVar10;
  double dVar11;
  
  fe = (fe_t *)__ckd_calloc__(1,0x88,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                              ,0xdd);
  fe->refcount = 1;
  iVar2 = fe_parse_general_params(config,fe);
  if (-1 < iVar2) {
    sVar8 = (short)(int)((float)fe->sampling_rate / (float)(int)fe->frame_rate + 0.5);
    fe->frame_shift = sVar8;
    sVar1 = (short)(int)((float)fe->sampling_rate * (float)fe->window_length + 0.5);
    fe->frame_size = sVar1;
    fe->pre_emphasis_prior = 0;
    if (sVar8 < 2) {
      __assert_fail("fe->frame_shift > 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                    ,0xee,"fe_t *fe_init_auto_r(cmd_ln_t *)");
    }
    if (sVar1 < sVar8) {
      pcVar9 = "Frame size %d (-wlen) must be greater than frame shift %d (-frate)\n";
      lVar10 = 0xf2;
    }
    else {
      sVar8 = fe->fft_size;
      if (sVar1 <= sVar8) {
        if (fe->dither != '\0') {
          fe_init_dither(fe->dither_seed);
          sVar1 = fe->frame_size;
        }
        piVar3 = (int16 *)__ckd_calloc__((long)sVar1,4,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                                         ,0x103);
        fe->overflow_samps = piVar3;
        in = (window_t *)
             __ckd_calloc__((long)(fe->frame_size / 2),8,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                            ,0x104);
        fe->hamming_window = in;
        fe_create_hamming(in,(int)fe->frame_size);
        mel = (melfb_t *)
              __ckd_calloc__(1,0x78,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                             ,0x10a);
        fe->mel_fb = mel;
        mel->sampling_rate = fe->sampling_rate;
        mel->fft_size = (int)fe->fft_size;
        mel->num_cepstra = (uint)fe->num_cepstra;
        uVar4 = ps_config_int(config,"nfilt");
        mel->num_filters = (int32)uVar4;
        if (fe->log_spec == '\0') {
          uVar4 = (ulong)fe->num_cepstra;
        }
        fe->feature_dimension = (uint8)uVar4;
        dVar11 = ps_config_float(config,"upperf");
        mel->upper_filt_freq = (float32)(float)dVar11;
        dVar11 = ps_config_float(config,"lowerf");
        mel->lower_filt_freq = (float32)(float)dVar11;
        iVar2 = ps_config_bool(config,"doublebw");
        mel->doublewide = iVar2;
        pcVar9 = ps_config_str(config,"warp_type");
        mel->warp_type = pcVar9;
        pcVar9 = ps_config_str(config,"warp_params");
        mel->warp_params = pcVar9;
        lVar10 = ps_config_int(config,"lifter");
        mel->lifter_val = (int32)lVar10;
        iVar2 = ps_config_bool(config,"unit_area");
        mel->unit_area = iVar2;
        iVar2 = ps_config_bool(config,"round_filters");
        mel->round_filters = iVar2;
        iVar2 = fe_warp_set(mel,mel->warp_type);
        if (iVar2 == 0) {
          fe_warp_set_parameters(mel,mel->warp_params,(float)mel->sampling_rate);
        }
        else {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                  ,0xae,"Failed to initialize the warping function.\n");
        }
        if ((float)fe->mel_fb->upper_filt_freq <= (float)fe->sampling_rate * 0.5 + 1.0) {
          fe_build_melfilters(fe->mel_fb);
          fe_compute_melcosine(fe->mel_fb);
          iVar2 = ps_config_bool(config,"remove_noise");
          if (iVar2 != 0) {
            pnVar5 = fe_init_noisestats(fe->mel_fb->num_filters);
            fe->noise_stats = pnVar5;
          }
          piVar3 = (int16 *)__ckd_calloc__((long)fe->frame_size,2,
                                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                                           ,0x11d);
          fe->spch = piVar3;
          pfVar6 = (frame_t *)
                   __ckd_calloc__((long)fe->fft_size,8,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                                  ,0x11e);
          fe->frame = pfVar6;
          ppVar7 = (powspec_t *)
                   __ckd_calloc__((long)fe->fft_size,8,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                                  ,0x11f);
          fe->spec = ppVar7;
          ppVar7 = (powspec_t *)
                   __ckd_calloc__((long)fe->mel_fb->num_filters,8,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                                  ,0x120);
          fe->mfspec = ppVar7;
          pfVar6 = (frame_t *)
                   __ckd_calloc__((long)(fe->fft_size / 4),8,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                                  ,0x123);
          fe->ccc = pfVar6;
          pfVar6 = (frame_t *)
                   __ckd_calloc__((long)(fe->fft_size / 4),8,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                                  ,0x124);
          fe->sss = pfVar6;
          fe_create_twiddle(fe);
          iVar2 = ps_config_bool(config,"verbose");
          if (iVar2 != 0) {
            fe_print_current(fe);
          }
          fe->num_overflow_samps = 0;
          memset(fe->overflow_samps,0,(long)fe->frame_size * 2);
          fe->pre_emphasis_prior = 0;
          return fe;
        }
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                ,0x111,"Upper frequency %.1f is higher than samprate/2 (%.1f)\n");
        goto LAB_00121b73;
      }
      pcVar9 = "Number of FFT points has to be a power of 2 higher than %d, it is %d\n";
      lVar10 = 0xfa;
    }
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
            ,lVar10,pcVar9,(ulong)(uint)(int)sVar1,(ulong)(uint)(int)sVar8);
  }
LAB_00121b73:
  fe_free(fe);
  return (fe_t *)0x0;
}

Assistant:

fe_t *
fe_init_auto_r(cmd_ln_t *config)
{
    fe_t *fe;

    fe = (fe_t*)ckd_calloc(1, sizeof(*fe));
    fe->refcount = 1;

    /* transfer params to front end */
    if (fe_parse_general_params(config, fe) < 0) {
        fe_free(fe);
        return NULL;
    }

    /* compute remaining fe parameters */
    /* We add 0.5 so approximate the float with the closest
     * integer. E.g., 2.3 is truncate to 2, whereas 3.7 becomes 4
     */
    fe->frame_shift = (int32) (fe->sampling_rate / fe->frame_rate + 0.5);
    fe->frame_size = (int32) (fe->window_length * fe->sampling_rate + 0.5);
    fe->pre_emphasis_prior = 0;

    assert (fe->frame_shift > 1);
    if (fe->frame_size < fe->frame_shift) {
        E_ERROR
            ("Frame size %d (-wlen) must be greater than frame shift %d (-frate)\n",
             fe->frame_size, fe->frame_shift);
        fe_free(fe);
        return NULL;
    }

    if (fe->frame_size > (fe->fft_size)) {
        E_ERROR
            ("Number of FFT points has to be a power of 2 higher than %d, it is %d\n",
             fe->frame_size, fe->fft_size);
        fe_free(fe);
        return NULL;
    }

    if (fe->dither)
        fe_init_dither(fe->dither_seed);

    /* establish buffers for overflow samps and hamming window */
    fe->overflow_samps = ckd_calloc(fe->frame_size, sizeof(float32));
    fe->hamming_window = ckd_calloc(fe->frame_size/2, sizeof(window_t));

    /* create hamming window */
    fe_create_hamming(fe->hamming_window, fe->frame_size);

    /* init and fill appropriate filter structure */
    fe->mel_fb = ckd_calloc(1, sizeof(*fe->mel_fb));

    /* transfer params to mel fb */
    fe_parse_melfb_params(config, fe, fe->mel_fb);
    
    if (fe->mel_fb->upper_filt_freq > fe->sampling_rate / 2 + 1.0) {
	E_ERROR("Upper frequency %.1f is higher than samprate/2 (%.1f)\n", 
		fe->mel_fb->upper_filt_freq, fe->sampling_rate / 2);
	fe_free(fe);
	return NULL;
    }
    
    fe_build_melfilters(fe->mel_fb);
    fe_compute_melcosine(fe->mel_fb);
    if (ps_config_bool(config, "remove_noise"))
        fe->noise_stats = fe_init_noisestats(fe->mel_fb->num_filters);

    /* Create temporary FFT, spectrum and mel-spectrum buffers. */
    /* FIXME: Gosh there are a lot of these. */
    fe->spch = ckd_calloc(fe->frame_size, sizeof(*fe->spch));
    fe->frame = ckd_calloc(fe->fft_size, sizeof(*fe->frame));
    fe->spec = ckd_calloc(fe->fft_size, sizeof(*fe->spec));
    fe->mfspec = ckd_calloc(fe->mel_fb->num_filters, sizeof(*fe->mfspec));

    /* create twiddle factors */
    fe->ccc = ckd_calloc(fe->fft_size / 4, sizeof(*fe->ccc));
    fe->sss = ckd_calloc(fe->fft_size / 4, sizeof(*fe->sss));
    fe_create_twiddle(fe);

    if (ps_config_bool(config, "verbose")) {
        fe_print_current(fe);
    }

    /*** Initialize the overflow buffers ***/
    fe_start_utt(fe);
    return fe;
}